

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

SourceLocation __thiscall
slang::SourceManager::getOriginalLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar2;
  ulong uVar3;
  SourceLocation SVar4;
  ulong uVar5;
  
  uVar5 = (ulong)location & 0xfffffff;
  if (uVar5 == 0) {
    SVar4 = (SourceLocation)0x0;
  }
  else {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            0x6db6db6db6db6db7;
    if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0xf4,"SourceLocation slang::SourceManager::getOriginalLoc(SourceLocation) const");
    }
    pvVar2 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                       (pvVar1 + uVar5);
    SVar4 = (SourceLocation)(((ulong)location & 0xfffffffff0000000) + (long)pvVar2->originalLoc);
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return SVar4;
}

Assistant:

void SourceManager::addUserDirectory(string_view path) {
    std::unique_lock lock(mut);
    userDirectories.push_back(fs::canonical(widen(path)));
}